

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O3

void __thiscall NshCmdArrayInit_Success_Test::TestBody(NshCmdArrayInit_Success_Test *this)

{
  uint *matchers_1;
  char *message;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar1;
  nsh_status_t status;
  nsh_cmd_array_t cmds;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  long local_420 [3];
  pointer local_408;
  AssertHelper local_400 [2];
  undefined1 local_3f0 [40];
  undefined1 local_3c8 [8];
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  long *local_398;
  long local_390;
  long local_388 [3];
  pointer local_370;
  nsh_status_t local_364;
  FieldsAreMatcher<std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_360;
  undefined8 local_330;
  nsh_cmd_array_t local_328;
  
  local_364 = nsh_cmd_array_init(&local_328);
  local_400[0].data_ = (AssertHelperData *)((ulong)local_400[0].data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            ((internal *)&local_430,"status","NSH_STATUS_OK",&local_364,(nsh_status *)local_400);
  if (local_430._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_400);
    if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_428->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_3c8 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x16,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_3c8 + 8),(Message *)local_400)
    ;
  }
  else {
    if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_428,local_428);
    }
    matchers_1 = &local_328.count;
    local_400[0].data_ = local_400[0].data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&local_430,"cmds.count","0",matchers_1,(int *)local_400);
    if (local_430._M_head_impl._0_1_ != (internal)0x0) {
      if (local_428 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_428,local_428);
      }
      local_330 = 0;
      message = "";
      testing::StrEq<char[1]>
                ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_3c8 + 8),(StringLike<char[1]> *)0x1530c8);
      testing::no_adl::
      FieldsAre<decltype(nullptr),testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>
                (&local_360,(no_adl *)&local_330,(void **)(local_3c8 + 8),
                 (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)matchers_1);
      local_430._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_430,
                 local_360.matchers_.
                 super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                 ._M_head_impl.impl_.string_._M_dataplus._M_p,
                 local_360.matchers_.
                 super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                 ._M_head_impl.impl_.string_._M_dataplus._M_p +
                 local_360.matchers_.
                 super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                 ._M_head_impl.impl_.string_._M_string_length);
      local_420[2]._0_1_ =
           local_360.matchers_.
           super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.expect_eq_;
      local_420[2]._1_1_ =
           local_360.matchers_.
           super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           ._M_head_impl.impl_.case_sensitive_;
      local_408 = (pointer)local_360.matchers_.
                           super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .super__Head_base<0UL,_std::nullptr_t,_false>._M_head_impl;
      local_398 = local_388;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_398,local_430._M_head_impl,
                 local_430._M_head_impl + (long)&(local_428->_M_dataplus)._M_p);
      local_388[2]._0_1_ = local_420[2]._0_1_;
      local_388[2]._1_1_ = local_420[2]._1_1_;
      local_370 = local_408;
      if (local_430._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420) {
        operator_delete(local_430._M_head_impl,local_420[0] + 1);
      }
      local_430._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_430,local_398,local_390 + (long)local_398);
      local_420[2]._0_1_ = local_388[2]._0_1_;
      local_420[2]._1_1_ = local_388[2]._1_1_;
      local_408 = local_370;
      local_400[0].data_ = (AssertHelperData *)local_3f0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_400,local_430._M_head_impl,
                 local_430._M_head_impl + (long)&local_428->_M_dataplus);
      local_3f0[0x10] = local_420[2]._0_1_;
      local_3f0[0x11] = local_420[2]._1_1_;
      local_3f0._24_8_ = local_408;
      if (local_430._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420) {
        operator_delete(local_430._M_head_impl,local_420[0] + 1);
      }
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::EachMatcher<testing::internal::FieldsAreMatcher<decltype(nullptr),testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::string>>>>>
      ::operator()(local_3f0 + 0x20,(char *)local_400,(nsh_cmd (*) [32])"cmds.array");
      if (local_400[0].data_ != (AssertHelperData *)local_3f0) {
        operator_delete(local_400[0].data_,local_3f0._0_8_ + 1);
      }
      if (local_398 != local_388) {
        operator_delete(local_398,local_388[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360.matchers_.
             super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
             ._M_head_impl.impl_.string_._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_360.matchers_.
                     super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                     ._M_head_impl + 0x10U)) {
        operator_delete(local_360.matchers_.
                        super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                        ._M_head_impl.impl_.string_._M_dataplus._M_p,
                        local_360.matchers_.
                        super__Tuple_impl<0UL,_std::nullptr_t,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super__Tuple_impl<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super__Head_base<1UL,_testing::PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                        ._M_head_impl.impl_.string_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0.impl_.string_._M_dataplus._M_p != &local_3c0.impl_.string_.field_2) {
        operator_delete(local_3c0.impl_.string_._M_dataplus._M_p,
                        local_3c0.impl_.string_.field_2._M_allocated_capacity + 1);
      }
      if (local_3f0[0x20] == '\0') {
        testing::Message::Message((Message *)&local_430);
        if (local_3c8 != (undefined1  [8])0x0) {
          message = *(char **)local_3c8;
        }
        testing::internal::AssertHelper::AssertHelper
                  (local_400,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x18,message);
        testing::internal::AssertHelper::operator=(local_400,(Message *)&local_430);
        testing::internal::AssertHelper::~AssertHelper(local_400);
        if (local_430._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_430._M_head_impl + 8))();
        }
      }
      if (local_3c8 == (undefined1  [8])0x0) {
        return;
      }
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_3c8;
      goto LAB_00115cff;
    }
    testing::Message::Message((Message *)local_400);
    if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_428->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_3c8 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x17,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_3c8 + 8),(Message *)local_400)
    ;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_3c8 + 8));
  if (local_400[0].data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_400[0].data_ + 8))();
  }
  if (local_428 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_428;
  local_3c8 = (undefined1  [8])local_428;
LAB_00115cff:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8)
  ;
  return;
}

Assistant:

TEST(NshCmdArrayInit, Success)
{
    nsh_cmd_array_t cmds;

    auto status = nsh_cmd_array_init(&cmds);

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_EQ(cmds.count, 0);
    ASSERT_THAT(cmds.array, Each(FieldsAre(nullptr, StrEq(""))));
}